

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_generator.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::cxx::CxxGenerator::Generate
          (CxxGenerator *this,FileDescriptor *file,string *parameter,
          GeneratorContext *generator_context,string *error)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  string *filename;
  undefined4 extraout_var;
  ZeroCopyOutputStream *pZVar6;
  undefined4 extraout_var_00;
  undefined1 local_220 [8];
  Printer printer_1;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> local_1b8;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> output_1;
  Printer printer;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> local_148;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> output;
  FileGenerator file_generator;
  string basename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  int local_8c;
  undefined1 local_88 [4];
  int i;
  Options file_options;
  undefined1 local_50 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  string *error_local;
  GeneratorContext *generator_context_local;
  string *parameter_local;
  FileDescriptor *file_local;
  CxxGenerator *this_local;
  
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)error;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_50);
  ParseGeneratorParameter
            (parameter,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  Options::Options((Options *)local_88);
  local_8c = 0;
  do {
    uVar3 = (ulong)local_8c;
    sVar4 = std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_50);
    if (sVar4 <= uVar3) {
      filename = FileDescriptor::name_abi_cxx11_(file);
      StripProto((string *)&file_generator.options_.safe_boundary_check,filename);
      std::__cxx11::string::append(&file_generator.options_.safe_boundary_check);
      FileGenerator::FileGenerator((FileGenerator *)&output,file,(Options *)local_88);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &printer.at_start_of_line_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &file_generator.options_.safe_boundary_check,".h");
      iVar2 = (*generator_context->_vptr_GeneratorContext[2])
                        (generator_context,&printer.at_start_of_line_);
      internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::scoped_ptr
                (&local_148,(ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar2));
      std::__cxx11::string::~string((string *)&printer.at_start_of_line_);
      pZVar6 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get(&local_148);
      io::Printer::Printer((Printer *)&output_1,pZVar6,'$');
      FileGenerator::GenerateHeader((FileGenerator *)&output,(Printer *)&output_1);
      io::Printer::~Printer((Printer *)&output_1);
      internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::~scoped_ptr(&local_148);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &printer_1.at_start_of_line_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &file_generator.options_.safe_boundary_check,".cc");
      iVar2 = (*generator_context->_vptr_GeneratorContext[2])
                        (generator_context,&printer_1.at_start_of_line_);
      internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::scoped_ptr
                (&local_1b8,(ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar2));
      std::__cxx11::string::~string((string *)&printer_1.at_start_of_line_);
      pZVar6 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get(&local_1b8);
      io::Printer::Printer((Printer *)local_220,pZVar6,'$');
      FileGenerator::GenerateSource((FileGenerator *)&output,(Printer *)local_220);
      io::Printer::~Printer((Printer *)local_220);
      internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::~scoped_ptr(&local_1b8);
      this_local._7_1_ = true;
      FileGenerator::~FileGenerator((FileGenerator *)&output);
      std::__cxx11::string::~string((string *)&file_generator.options_.safe_boundary_check);
LAB_0029f9d2:
      Options::~Options((Options *)local_88);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_50);
      return this_local._7_1_;
    }
    pvVar5 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,(long)local_8c);
    bVar1 = std::operator==(&pvVar5->first,"dllexport_decl");
    if (bVar1) {
      pvVar5 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_50,(long)local_8c);
      std::__cxx11::string::operator=((string *)local_88,(string *)&pvVar5->second);
    }
    else {
      pvVar5 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_50,(long)local_8c);
      bVar1 = std::operator==(&pvVar5->first,"safe_boundary_check");
      if (!bVar1) {
        pvVar5 = std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_50,(long)local_8c);
        std::operator+(&local_b0,"Unknown generator option: ",&pvVar5->first);
        std::__cxx11::string::operator=
                  ((string *)
                   options.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        this_local._7_1_ = false;
        goto LAB_0029f9d2;
      }
      file_options.dllexport_decl.field_2._M_local_buf[8] = '\x01';
    }
    local_8c = local_8c + 1;
  } while( true );
}

Assistant:

bool CxxGenerator::Generate(const FileDescriptor* file,
                            const string& parameter,
                            GeneratorContext* generator_context,
                            string* error) const {
  vector<pair<string, string> > options;
  ParseGeneratorParameter(parameter, &options);

  // -----------------------------------------------------------------
  // parse generator options

  // TODO(kenton):  If we ever have more options, we may want to create a
  //   class that encapsulates them which we can pass down to all the
  //   generator classes.  Currently we pass dllexport_decl down to all of
  //   them via the constructors, but we don't want to have to add another
  //   constructor parameter for every option.

  // If the dllexport_decl option is passed to the compiler, we need to write
  // it in front of every symbol that should be exported if this .proto is
  // compiled into a Windows DLL.  E.g., if the user invokes the protocol
  // compiler as:
  //   protoc --cxx_out=dllexport_decl=FOO_EXPORT:outdir foo.proto
  // then we'll define classes like this:
  //   class FOO_EXPORT Foo {
  //     ...
  //   }
  // FOO_EXPORT is a macro which should expand to __declspec(dllexport) or
  // __declspec(dllimport) depending on what is being compiled.
  Options file_options;

  for (int i = 0; i < options.size(); i++) {
    if (options[i].first == "dllexport_decl") {
      file_options.dllexport_decl = options[i].second;
    } else if (options[i].first == "safe_boundary_check") {
      file_options.safe_boundary_check = true;
    } else {
      *error = "Unknown generator option: " + options[i].first;
      return false;
    }
  }

  // -----------------------------------------------------------------


  string basename = StripProto(file->name());
  basename.append(".pb");

  FileGenerator file_generator(file, file_options);

  // Generate header.
  {
    scoped_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(basename + ".h"));
    io::Printer printer(output.get(), '$');
    file_generator.GenerateHeader(&printer);
  }

  // Generate cc file.
  {
    scoped_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(basename + ".cc"));
    io::Printer printer(output.get(), '$');
    file_generator.GenerateSource(&printer);
  }

  return true;
}